

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Impl *this_00;
  RawSchema *pRVar1;
  char (*in_R8) [2];
  TryGetResult TVar2;
  StringPtr name;
  uint local_84;
  uint64_t id_local;
  uint local_74;
  ArrayPtr<const_char> local_70;
  Reader node;
  Fault f;
  
  id_local = id;
  TVar2 = Impl::tryGet(this->loader,id);
  pRVar1 = TVar2.schema;
  if (pRVar1 == (RawSchema *)0x0) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              ((String *)&node,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x1a9b4b,in_R8);
    if (node._reader.capTable == (CapTableReader *)0x0) {
      node._reader.segment = (SegmentReader *)0x1ae02f;
    }
    name.content.size_ =
         (long)&(node._reader.capTable)->_vptr_CapTableReader +
         (ulong)(node._reader.capTable == (CapTableReader *)0x0);
    name.content.ptr = (char *)node._reader.segment;
    pRVar1 = Impl::loadEmpty(this_00,id,name,expectedKind,true);
    kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
    upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>
              ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,id,pRVar1,
               (anon_class_1_0_00000001 *)&local_70);
    kj::Array<char>::~Array((Array<char> *)&node);
    return;
  }
  readMessageUnchecked<capnp::schema::Node>(&node,pRVar1->encodedNode);
  if (node._reader.dataSize < 0x70) {
    if (expectedKind == FILE) {
LAB_00173288:
      kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
      upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>
                ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,id,pRVar1,
                 (anon_class_1_0_00000001 *)&local_70);
      return;
    }
    local_74 = 0;
  }
  else {
    local_74 = (uint)*(Which *)((long)node._reader.data + 0xc);
    if (*(Which *)((long)node._reader.data + 0xc) == expectedKind) goto LAB_00173288;
  }
  local_84 = (uint)expectedKind;
  local_70 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&node);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x25d,FAILED,"node.which() == expectedKind",
             "\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
             ,(char (*) [46])"expected a different kind of node for this ID",&id_local,&local_84,
             &local_74,(Reader *)&local_70);
  this->isValid = false;
  kj::_::Debug::Fault::~Fault(&f);
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }